

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_testany_(MPIABI_Fint *count,MPIABI_Fint *array_of_requests,int *index,int *flag,
                    MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_testany_();
  return;
}

Assistant:

void mpiabi_testany_(
  const MPIABI_Fint * count,
  MPIABI_Fint * array_of_requests,
  int * index,
  int * flag,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_testany_(
    count,
    array_of_requests,
    index,
    flag,
    status,
    ierror
  );
}